

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cc
# Opt level: O2

int main(void)

{
  long lVar1;
  double dVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  int i;
  double dVar6;
  Matrix3d *pMVar7;
  Matrix<double,_3,_1,_0,_3,_1> *src;
  Matrix3d *pMVar8;
  long lVar9;
  byte bVar10;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_658;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_650;
  undefined8 local_648;
  MatrixXd *local_640;
  Matrix<double,_3,_1,_0,_3,_1> *local_638;
  Matrix<double,_3,_1,_0,_3,_1> *local_630;
  Index local_628;
  Vector3d *local_618;
  MatrixXd lighttime_truth;
  MatrixXd pred_meas;
  MatrixXd true_meas;
  MatrixXd pos_ECI2;
  MatrixXd iau1980;
  MatrixXd nut80;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  matvec;
  Vector3d pos2;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  DenseStorage<double,__1,__1,__1,_0> local_508;
  DenseStorage<double,__1,__1,__1,_0> local_4f0;
  MatrixXd t_R_test;
  Propagator local_4c0;
  double local_388;
  double dStack_380;
  double local_378;
  Vector3d vel0;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  string local_310;
  Vector3d obs_station_iter;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  EGM96Grav gravmodel;
  Matrix<double,_3,_1,_0,_3,_1> local_158;
  Matrix<double,_3,_1,_0,_3,_1> local_138;
  Matrix<double,_3,_1,_0,_3,_1> local_118;
  Vector3d pos0;
  undefined1 local_d8 [24];
  Vector3d vel1;
  Vector3d pos1;
  Vector3d pos_ECI;
  Matrix3d R;
  
  bVar10 = 0;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 0x11;
  local_328 = 0xc0dc10949906cca3;
  uStack_320 = 0xc0de1f04a0e410b6;
  local_318 = 0xc01adf3b645a1cac;
  local_348 = 0x40d2b75c7d4d1be5;
  uStack_340 = 0xc0e255a1f704fa5b;
  local_338 = 0xc044859502c2d3b4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"../data/nut80.csv",(allocator<char> *)&local_4c0);
  Util::LoadDatFile(&nut80,&local_1f8,0x6a,10);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"../data/iau1980modified.csv",(allocator<char> *)&local_4c0);
  Util::LoadDatFile(&iau1980,&local_218,0x449b,5);
  std::__cxx11::string::~string((string *)&local_218);
  dVar2 = Util::JulianDateNatural2JD(2017.0,12.0,1.0,0.0,0.0,48.0000384);
  std::operator<<((ostream *)&std::cout,"Julian Date: ");
  poVar4 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar4,"\n");
  local_4c0._0_8_ = (Matrix3d *)0x3ff0000000000000;
  local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  local_4c0.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 1.0;
  local_4c0.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  local_4c0.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  local_4c0.STM_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_4c0.STM_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0x3ff0000000000000;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector(&matvec,5,(value_type *)&local_4c0,(allocator_type *)&gravmodel);
  Util::ECEF2ECI(&R,dVar2,&nut80,&iau1980,&matvec);
  local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = (double)&local_328;
  local_4c0._0_8_ = &R;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pos_ECI,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_4c0);
  poVar4 = std::operator<<((ostream *)&std::cout,"Error [cm]: \n");
  local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 100000.0;
  local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = (double)&local_348;
  local_4c0.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = (double)&pos_ECI;
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                                     *)&local_4c0);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"../data/t_ECF_test.csv",(allocator<char> *)&local_4c0);
  Util::LoadDatFile(&t_R_test,&local_238,0x361,1);
  std::__cxx11::string::~string((string *)&local_238);
  local_528 = 0x40b8ea22e48e8a72;
  uStack_520 = 0x40b8ea22e48e8a72;
  local_518 = 0x40b8ea22e48e8a72;
  poVar4 = std::operator<<((ostream *)&std::cout,"ECEF Test Position: \n");
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_528);
  std::operator<<(poVar4,"\n");
  dVar2 = Util::JulianDateNatural2JD(2018.0,3.0,23.0,8.0,55.0,3.0);
  local_4c0._0_8_ = (Matrix3d *)0x3;
  local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 4.27366783652678e-321;
  local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&pos_ECI2,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_4c0);
  for (dVar6 = 0.0; dVar6 != 4.27366783652678e-321; dVar6 = (double)((long)dVar6 + 1)) {
    Util::ECEF2ECI((Matrix3d *)&local_4c0,
                   t_R_test.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data[(long)dVar6] / 86400.0 + dVar2,&nut80,&iau1980,&matvec);
    gravmodel.mu_ = (double)&R;
    pMVar7 = (Matrix3d *)&local_4c0;
    pMVar8 = (Matrix3d *)gravmodel.mu_;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
      [0] = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
      pMVar7 = (Matrix3d *)((long)pMVar7 + ((ulong)bVar10 * -2 + 1) * 8);
      pMVar8 = (Matrix3d *)((long)pMVar8 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    local_4c0._0_8_ =
         pos_ECI2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         + pos_ECI2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows * (long)dVar6;
    local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = 1.48219693752374e-323;
    local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = 4.94065645841247e-324;
    local_4c0.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = 0.0;
    gravmodel.Rearth_ = (double)&local_528;
    local_4c0.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = (double)pos_ECI2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows;
    local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = (double)&pos_ECI2;
    local_4c0.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dVar6;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_4c0,
               (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                *)&gravmodel);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"../data/pred_ECIpos.csv",(allocator<char> *)&local_4c0);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_4f0,(DenseStorage<double,__1,__1,__1,_0> *)&pos_ECI2);
  Util::Eigen2csv(&local_258,(MatrixXd *)&local_4f0);
  free(local_4f0.m_data);
  std::__cxx11::string::~string((string *)&local_258);
  VehicleState::Propagator::Propagator(&local_4c0);
  local_4c0.mu_ = 398600.4415;
  local_4c0.mu_sun_ = 132712440018.0;
  local_4c0.mu_moon_ = 4902.800066;
  local_4c0.AU_ = 149597870.7;
  local_4c0.J2_ = 0.00108248;
  local_4c0.J3_ = 2.5327e-06;
  local_4c0.Rearth_ = 6378.1363;
  local_4c0.earthrotationspeed_ = 7.292115146706979e-05;
  local_4c0.C_D_ = 1.88;
  local_4c0.A_ = 15.0;
  local_4c0.m_ = 2000.0;
  local_4c0.rho_0_ = 3.614e-13;
  local_4c0.r0_ = 7078.1363;
  local_4c0.H_ = 88.667;
  local_4c0.useJ2_ = false;
  local_4c0.usedrag_ = false;
  local_4c0.useSRP_ = false;
  local_4c0.useLuniSolar_ = false;
  local_4c0.use20x20_ = true;
  Util::EGM96Grav::EGM96Grav(&gravmodel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"../data/egm96_C_normalized.csv",(allocator<char> *)&local_658);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"../data/egm96_S_normalized.csv",(allocator<char> *)&pos0);
  Util::EGM96Grav::LoadNormCoeffs(&gravmodel,&local_278,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  Util::EGM96Grav::NormCoeffs2Reg(&gravmodel);
  gravmodel.mu_ = local_4c0.mu_;
  gravmodel.Rearth_ = local_4c0.Rearth_;
  gravmodel.nut80ptr_ = &nut80;
  gravmodel.iau1980ptr_ = &iau1980;
  pos0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       6984.46459301679;
  pos0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       1612.22237259524;
  pos0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       13.0914313353482;
  vel0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       -1.67664476668291;
  vel0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       7.26144494619245;
  vel0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.259889921085112;
  local_4c0.gravmodel_ = &gravmodel;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_4c0.pos_,&pos0);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_4c0.vel_,&vel0);
  local_4c0.t_JD_ = Util::JulianDateNatural2JD(2018.0,2.0,1.0,5.0,0.0,0.0);
  local_4c0.abstol_ = 1e-16;
  local_4c0.dt_var_ = 0.1;
  local_4c0.reltol_ = 3e-14;
  local_4c0._0_5_ = 0x101010101;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"../data/lighttime_truth.csv",(allocator<char> *)&local_658);
  Util::LoadDatFile(&lighttime_truth,&local_2b8,0x71,7);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"../data/LEO_Data_Apparent.csv",(allocator<char> *)&local_658);
  Util::LoadDatFile(&true_meas,&local_2d8,0x71,4);
  std::__cxx11::string::~string((string *)&local_2d8);
  local_658 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x2;
  local_650 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x71;
  local_648 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&pred_meas,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_658);
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       -6143.584;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       1364.25;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       1033.743;
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1907.295;
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       6030.81;
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       -817.119;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       2390.31;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       -5564.341;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       1994.578;
  local_4c0.dt_var_ = -0.1;
  lVar5 = -0x71;
  lVar9 = 0;
  do {
    if (lVar9 == 0x388) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"../data/pred_meas.csv",(allocator<char> *)&local_658);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_508,(DenseStorage<double,__1,__1,__1,_0> *)&pred_meas);
      Util::Eigen2csv(&local_310,(MatrixXd *)&local_508);
      free(local_508.m_data);
      std::__cxx11::string::~string((string *)&local_310);
      free(pred_meas.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(true_meas.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(lighttime_truth.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      Util::EGM96Grav::~EGM96Grav(&gravmodel);
      free(local_4c0.STM_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data);
      free(pos_ECI2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(t_R_test.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      std::
      _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ::~_Vector_base(&matvec.
                       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     );
      free(iau1980.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
          );
      free(nut80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
      return 0;
    }
    lVar1 = lVar5 + 0x71;
    local_658 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                ((long)lighttime_truth.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data + lVar9);
    local_4c0.t_ = *(double *)
                    (lighttime_truth.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows * 0x30 + (long)local_658);
    local_650 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x1;
    local_648 = 3;
    local_630 = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
    local_628 = lighttime_truth.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
    local_640 = &lighttime_truth;
    local_638 = (Matrix<double,_3,_1,_0,_3,_1> *)lVar1;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>>
              (&local_4c0.pos_,
               (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               &local_658);
    local_658 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                ((long)lighttime_truth.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data +
                lVar9 + lighttime_truth.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_rows * 0x18);
    local_650 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x1;
    local_648 = 3;
    local_630 = (Matrix<double,_3,_1,_0,_3,_1> *)0x3;
    local_628 = lighttime_truth.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
    local_640 = &lighttime_truth;
    local_638 = (Matrix<double,_3,_1,_0,_3,_1> *)lVar1;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>>
              (&local_4c0.vel_,
               (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               &local_658);
    pos2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    pos2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    pos2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         local_4c0.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1];
    dVar2 = *(double *)
             ((long)true_meas.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data +
             lVar9 + true_meas.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 0x10) / 299792.0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)&pos1,&local_4c0.pos_);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&vel1,&local_4c0.vel_);
    poVar4 = std::operator<<((ostream *)&std::cout,"Pos1: \n");
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pos1);
    std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<((ostream *)&std::cout,"Pos2: \n");
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pos2);
    std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<((ostream *)&std::cout,"Pos1 + tof*Vel1: \n");
    local_658 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pos1;
    local_640 = (MatrixXd *)dVar2;
    local_638 = &vel1;
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                                       *)&local_658);
    std::operator<<(poVar4,"\n");
    std::operator<<((ostream *)&std::cout,"tof: ");
    poVar4 = std::ostream::_M_insert<double>(dVar2);
    std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<((ostream *)&std::cout,"Pos1 + tof*Vel1 - Pos2: \n");
    local_618 = &pos2;
    local_650 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pos1;
    local_638 = (Matrix<double,_3,_1,_0,_3,_1> *)dVar2;
    local_630 = &vel1;
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       *)&local_658);
    std::operator<<(poVar4,"\n");
    iVar3 = (int)*(double *)
                  ((long)true_meas.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_data + lVar9);
    src = &local_118;
    if (iVar3 == 1) {
LAB_001051fc:
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                (&obs_station_iter,src);
    }
    else {
      if (iVar3 == 2) {
        src = &local_138;
        goto LAB_001051fc;
      }
      if (iVar3 == 3) {
        src = &local_158;
        goto LAB_001051fc;
      }
      std::operator<<((ostream *)&std::cout,"Error: bad case in measurement \n");
    }
    local_4c0.t_ = *(double *)
                    ((long)lighttime_truth.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data +
                    lVar9 + lighttime_truth.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows * 0x30);
    local_388 = obs_station_iter.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[0];
    dStack_380 = obs_station_iter.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[1];
    local_378 = obs_station_iter.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[2];
    VehicleState::Propagator::GetRangeAndRate((Propagator *)local_d8,(Vector3d *)&local_4c0,dVar2);
    local_658 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                (pred_meas.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data +
                pred_meas.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows * lVar1);
    local_650 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x2;
    local_648 = 1;
    local_640 = &pred_meas;
    local_638 = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
    local_628 = pred_meas.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows;
    local_630 = (Matrix<double,_3,_1,_0,_3,_1> *)lVar1;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,2,1,0,2,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_658,
               (Matrix<double,_2,_1,_0,_2,_1> *)local_d8);
    lVar9 = lVar9 + 8;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int main() {

	//////////////// Test ECI to ECEF //////////////////

	//precision
	std::cout << std::setprecision(17);

	//initialize position and time
	Eigen::Vector3d pos_ECEF(-28738.3218400000, -30844.0723200000, -6.71800000000000);

	//target position
	Eigen::Vector3d targ_pos_ECI(19165.44514777874, -37549.06140374086, -41.043609948282580);

	//load some data files
	Eigen::MatrixXd nut80 = Util::LoadDatFile("../data/nut80.csv", 106, 10);
	Eigen::MatrixXd iau1980 = Util::LoadDatFile("../data/iau1980modified.csv",17563, 5);

	//check Julian date algorithm
	double t_JD = Util::JulianDateNatural2JD(2017.0, 12.0, 1.0, 0.0, 0.0, 48.0000384);

	std::cout << "Julian Date: " << t_JD << "\n";

	// get rotation matrix
	std::vector<Eigen::Matrix3d> matvec(5, Eigen::Matrix3d::Identity(3,3));
	Eigen::Matrix3d R = Util::ECEF2ECI(t_JD, &nut80, &iau1980, &matvec);

	//rotate
	Eigen::Vector3d pos_ECI = R*pos_ECEF;

	//error
	std::cout << "Error [cm]: \n" << 100.0*1000.0*(targ_pos_ECI - pos_ECI) << "\n";

	//load the test times
	Eigen::MatrixXd t_R_test = Util::LoadDatFile("../data/t_ECF_test.csv",865,1);

	//load test position
	// Eigen::MatrixXd r_ECF_test = Util::LoadDatFile("../data/r_ECF_test.csv",1,3);
	Eigen::Vector3d pos_ECEF2(6378.136300000000, 6378.136300000000, 6378.136300000000);

	std::cout << "ECEF Test Position: \n" << pos_ECEF2 << "\n";

	//reset julian date to project epoch
	t_JD = Util::JulianDateNatural2JD(2018.0, 3.0, 23.0, 8.0, 55.0, 3.0);

	//initialize ECI matrix
	Eigen::MatrixXd pos_ECI2 = Eigen::MatrixXd::Zero(3,865);

	//perform rotations
	for (int i = 0; i < 865; ++i)	{
		R = Util::ECEF2ECI(t_JD + t_R_test(i,0)/(24.0*60.0*60.0), &nut80, &iau1980, &matvec);
		pos_ECI2.block(0,i,3,1) = R*pos_ECEF2;
	}

	//save data
	Util::Eigen2csv("../data/pred_ECIpos.csv", pos_ECI2);


	// exit(0);s
	////////////////////////////////////////////////////


	///////////////// Test Propagator /////////////////////

	//form a propagator object
	VehicleState::Propagator propobj;

	//set physics constants
	propobj.mu_ = 398600.4415; // km^3/sec^2
	propobj.mu_sun_ = 132712440018.0; //km^3/sec^2
	propobj.mu_moon_ = 4902.800066; //km^3/sec^2
	propobj.AU_ = 149597870.7;
	propobj.J2_ = 0.00108248;
	propobj.J3_ = 0.0000025327;
	propobj.Rearth_ = 6378.1363; //km
	propobj.earthrotationspeed_ = 7.292115146706979 * pow(10.0,-5.0); // rad/sec
	propobj.C_D_ = 1.88;
	propobj.A_ = 15; // m^2
	propobj.m_ = 2000.0; //kg
	propobj.rho_0_ = 3.614*pow(10.0,-13.0); //kg/m^3
	propobj.r0_ = 700.0 + propobj.Rearth_; //km
	propobj.H_ = 88.6670; //km

	//parameters
	propobj.useJ2_ = false;
	propobj.use20x20_ = true;
	propobj.usedrag_ = false;
	propobj.useSRP_ = false;
	propobj.useLuniSolar_ = false; //gravity of sun and moon

	//form a gravity object
	Util::EGM96Grav gravmodel;
	gravmodel.LoadNormCoeffs("../data/egm96_C_normalized.csv", "../data/egm96_S_normalized.csv");
	gravmodel.NormCoeffs2Reg();
	gravmodel.mu_ = propobj.mu_;
	gravmodel.Rearth_ = propobj.Rearth_;
	gravmodel.nut80ptr_ = &nut80; 
	gravmodel.iau1980ptr_ = &iau1980;
	propobj.gravmodel_ = &gravmodel;

	//set objects position and velocity (from lighttime_truth.mat)
	Eigen::Vector3d pos0;
	pos0[0] = 6984.46459301679;
	pos0[1] = 1612.22237259524;
	pos0[2] = 13.0914313353482;

	Eigen::Vector3d vel0;
	vel0[0] = -1.67664476668291;
	vel0[1] = 7.26144494619245;
	vel0[2] =  0.259889921085112;

	//set objects position and velocity (from HW5 assignment)
	// Eigen::Vector3d pos0;
	// pos0[0] = 6990077.798814194;
	// pos0[1] = 1617465.311978378;
	// pos0[2] = 22679.810569245355;
	// pos0 = pos0/1000.0; //convert units

	// Eigen::Vector3d vel0;
	// vel0[0] = -1675.13972506056;
	// vel0[1] = 7273.72441330686;
	// vel0[2] =  252.688512916741;
	// vel0 = vel0/1000.0; //convert units

	propobj.pos_ = pos0;
	propobj.vel_ = vel0;

	propobj.t_JD_ = Util::JulianDateNatural2JD(2018.0, 2.0, 1.0, 5.0, 0.0, 0.0);

	//set tolerance options
	propobj.abstol_ = 1.0*pow(10.0,-16.0);
	propobj.reltol_ = 3.0*pow(10.0,-14.0);
	propobj.dt_var_ = 0.1;

	// propagate
	// propobj.Propagate(21600.0, false);

	//true final position and velocity

	//lighttime_truth.mat
	// Eigen::Vector3d posf_true(-5153.82535324096, -4954.3861758395, -144.823727065817);
	// Eigen::Vector3d velf_true(5.17802136652852, -5.38752135424995, -0.211929233793885);

	// .xlsx file (20x20 only)
	Eigen::Vector3d posf_true(-5153.77192464701, -4954.43582198601, -144.832817220038);
	Eigen::Vector3d velf_true(5.17808108556007, -5.38747088174872, -0.211928868806419);

	//output
	// std::cout << "Final Position:\n" << propobj.pos_ << "\n" << "Error [m]:\n" << 1000.0*(propobj.pos_ - posf_true) << "\n";
	// std::cout << "Final Velocity:\n" << propobj.vel_ << "\n" << "Error [m/sec]:\n" << 1000.0*(propobj.vel_ - velf_true) << "\n";

	//////////////////////////////////////////////////////////////

	//////////////// Test Measurement Predictions /////////////////////

	//simple propagation
	propobj.useJ2_ = true;
	propobj.use20x20_ = true;
	propobj.usedrag_ = true;
	propobj.useSRP_ = true;
	propobj.useLuniSolar_ = true; //gravity of sun and moon

	// load true state and measurements
	Eigen::MatrixXd lighttime_truth = Util::LoadDatFile("../data/lighttime_truth.csv",113, 7);
	Eigen::MatrixXd true_meas = Util::LoadDatFile("../data/LEO_Data_Apparent.csv",113, 4);
	//initialize predicted measurements
	Eigen::MatrixXd pred_meas = Eigen::MatrixXd::Zero(2,113);

	//set observation station ECEF location
	Eigen::Vector3d obs_station1{-6143.584, 1364.250, 1033.743}; //atoll / Kwajalein
	Eigen::Vector3d obs_station2{1907.295, 6030.810, -817.119}; //diego garcia
	Eigen::Vector3d obs_station3{2390.310, -5564.341, 1994.578}; //arecibo

	double c = 299792.0; //speed of light km/sec

	propobj.dt_var_ = -0.1; //only doing backwards props

	//vector for use with choosing station
	Eigen::Vector3d obs_station_iter;

	// cycle through all the measurements, create a predicted measurement at each
	for (int i = 0; i < 113; ++i){
		
		//set time of object
		propobj.t_ = lighttime_truth(i,6);

		//set true state of object
		propobj.pos_ = lighttime_truth.block(i,0,1,3).transpose();
		propobj.vel_ = lighttime_truth.block(i,3,1,3).transpose();

		Eigen::Vector3d pos1;
		Eigen::Vector3d vel1;
		Eigen::Vector3d pos2 = propobj.pos_;
		Eigen::Vector3d vel2 = propobj.vel_;

		//approximate tof
		double tof = true_meas(i,2)/c;

		//propagate backwards in time to measurement
		// propobj.Propagate(-1.0*tof,false);

		pos1 = propobj.pos_;
		vel1 = propobj.vel_;

		std::cout << "Pos1: \n" << pos1 << "\n";
		std::cout << "Pos2: \n" << pos2 << "\n";
		std::cout << "Pos1 + tof*Vel1: \n" << pos1 + tof*vel1 << "\n";
		std::cout << "tof: " << tof << "\n";
		std::cout << "Pos1 + tof*Vel1 - Pos2: \n" << pos1 + tof*vel1 - pos2 << "\n";	

		//determine which tracking station was used
		int stationID = (int) true_meas(i, 0);

		switch(stationID) {
			case 1:
				obs_station_iter = obs_station1;
				break;

			case 2:
				obs_station_iter = obs_station2;
				break;

			case 3:
				obs_station_iter = obs_station3;
				break;

			default: std::cout << "Error: bad case in measurement \n";
		}

		//reset time
		propobj.t_ = lighttime_truth(i,6);

		//approximate measurement
		pred_meas.block(0,i,2,1) = propobj.GetRangeAndRate(obs_station_iter, 1.0*tof);

		// for (int j = 0; j < 5; ++j){

		// 	//approximate measurement
		// 	pred_meas.block(0,i,2,1) = propobj.GetRangeAndRate(obs_station_iter, 1.0*tof);

		// 	std::cout << "Change in ToF: " << tof - pred_meas(0,i)/c << "\n";

		// 	//reset time of flight
		// 	tof = pred_meas(0,i)/c;
		// }
		

		// exit(0);

	}

	//write out the predicted measurements
	Util::Eigen2csv("../data/pred_meas.csv", pred_meas);

	return 0;
}